

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O3

pair<int,_int> *
frozen::bits::partition<std::pair<int,int>*,frozen::impl::CompareKey<std::less<int>>>
          (pair<int,_int> *left,pair<int,_int> *right,CompareKey<std::less<int>_> *compare)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar2 = (long)right - (long)left;
  uVar4 = (lVar2 >> 3) - (lVar2 >> 0x3f) & 0xfffffffffffffffe;
  iVar1 = right->first;
  right->first = (&left->first)[uVar4];
  (&left->first)[uVar4] = iVar1;
  iVar1 = right->second;
  right->second = (&left->second)[uVar4];
  (&left->second)[uVar4] = iVar1;
  if (0 < lVar2) {
    piVar3 = &left->second;
    do {
      iVar1 = ((pair<int,_int> *)(piVar3 + -1))->first;
      if (iVar1 < right->first) {
        ((pair<int,_int> *)(piVar3 + -1))->first = left->first;
        left->first = iVar1;
        iVar1 = *piVar3;
        *piVar3 = left->second;
        left->second = iVar1;
        left = left + 1;
      }
      piVar3 = piVar3 + 2;
      bVar5 = SCARRY8(lVar2,-8);
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0 && bVar5 == lVar2 < 0);
  }
  iVar1 = right->first;
  right->first = left->first;
  left->first = iVar1;
  iVar1 = right->second;
  right->second = left->second;
  left->second = iVar1;
  return left;
}

Assistant:

constexpr Iterator partition(Iterator left, Iterator right, Compare const &compare) {
  auto pivot = left + (right - left) / 2;
  iter_swap(right, pivot);
  pivot = right;
  for (auto it = left; 0 < right - it; ++it) {
    if (compare(*it, *pivot)) {
      iter_swap(it, left);
      left++;
    }
  }
  iter_swap(pivot, left);
  pivot = left;
  return pivot;
}